

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.cpp
# Opt level: O1

void __thiscall Map::Map(Map *this,int id,World *world)

{
  TimeEvent *this_00;
  
  (this->characters).super__List_base<Character_*,_std::allocator<Character_*>_>._M_impl._M_node.
  super__List_node_base._M_prev = (_List_node_base *)&this->characters;
  (this->characters).super__List_base<Character_*,_std::allocator<Character_*>_>._M_impl._M_node.
  super__List_node_base._M_next = (_List_node_base *)&this->characters;
  (this->characters).super__List_base<Character_*,_std::allocator<Character_*>_>._M_impl._M_node.
  _M_size = 0;
  (this->npcs).super__Vector_base<NPC_*,_std::allocator<NPC_*>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->npcs).super__Vector_base<NPC_*,_std::allocator<NPC_*>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->npcs).super__Vector_base<NPC_*,_std::allocator<NPC_*>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (this->chests).
  super__Vector_base<std::shared_ptr<Map_Chest>,_std::allocator<std::shared_ptr<Map_Chest>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->chests).
  super__Vector_base<std::shared_ptr<Map_Chest>,_std::allocator<std::shared_ptr<Map_Chest>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->chests).
  super__Vector_base<std::shared_ptr<Map_Chest>,_std::allocator<std::shared_ptr<Map_Chest>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->items).
  super__List_base<std::shared_ptr<Map_Item>,_std::allocator<std::shared_ptr<Map_Item>_>_>._M_impl.
  _M_node.super__List_node_base._M_prev = (_List_node_base *)&this->items;
  (this->items).
  super__List_base<std::shared_ptr<Map_Item>,_std::allocator<std::shared_ptr<Map_Item>_>_>._M_impl.
  _M_node.super__List_node_base._M_next = (_List_node_base *)&this->items;
  (this->items).
  super__List_base<std::shared_ptr<Map_Item>,_std::allocator<std::shared_ptr<Map_Item>_>_>._M_impl.
  _M_node._M_size = 0;
  (this->tiles).super__Vector_base<Map_Tile,_std::allocator<Map_Tile>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->tiles).super__Vector_base<Map_Tile,_std::allocator<Map_Tile>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->tiles).super__Vector_base<Map_Tile,_std::allocator<Map_Tile>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->jukebox_player)._M_dataplus._M_p = (pointer)&(this->jukebox_player).field_2;
  (this->jukebox_player)._M_string_length = 0;
  (this->jukebox_player).field_2._M_local_buf[0] = '\0';
  this->id = (short)id;
  this->world = world;
  this->exists = false;
  this->jukebox_protect = 0.0;
  this->arena = (Arena *)0x0;
  this->evacuate_lock = false;
  this->has_timed_spikes = false;
  LoadArena(this);
  Load(this);
  if ((this->chests).
      super__Vector_base<std::shared_ptr<Map_Chest>,_std::allocator<std::shared_ptr<Map_Chest>_>_>.
      _M_impl.super__Vector_impl_data._M_start !=
      (this->chests).
      super__Vector_base<std::shared_ptr<Map_Chest>,_std::allocator<std::shared_ptr<Map_Chest>_>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    this_00 = (TimeEvent *)operator_new(0x30);
    TimeEvent::TimeEvent(this_00,map_spawn_chests,this,60.0,-1);
    Timer::Register(&this->world->timer,this_00);
  }
  return;
}

Assistant:

Map::Map(int id, World *world)
{
	this->id = id;
	this->world = world;
	this->exists = false;
	this->jukebox_protect = 0.0;
	this->arena = 0;
	this->evacuate_lock = false;
	this->has_timed_spikes = false;

	this->LoadArena();

	this->Load();

	if (!this->chests.empty())
	{
		TimeEvent *event = new TimeEvent(map_spawn_chests, this, 60.0, Timer::FOREVER);
		this->world->timer.Register(event);
	}
}